

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdsystem.cpp
# Opt level: O3

SQInteger sqstd_register_systemlib(HSQUIRRELVM v)

{
  SQInteger nparamscheck;
  long lVar1;
  char *s;
  
  s = "getenv";
  lVar1 = 0x20;
  do {
    sq_pushstring(v,s,-1);
    nparamscheck = *(SQInteger *)((long)&stringlib_funcs[9].nparamscheck + lVar1);
    sq_newclosure(v,*(SQFUNCTION *)((long)&stringlib_funcs[9].f + lVar1),0);
    sq_setparamscheck(v,nparamscheck,*(SQChar **)((long)&stringlib_funcs[9].typemask + lVar1));
    sq_setnativeclosurename(v,-1,s);
    sq_newslot(v,-3,0);
    s = *(char **)((long)&systemlib_funcs[0].name + lVar1);
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x100);
  return 1;
}

Assistant:

SQInteger sqstd_register_systemlib(HSQUIRRELVM v)
{
    SQInteger i=0;
    while(systemlib_funcs[i].name!=0)
    {
        sq_pushstring(v,systemlib_funcs[i].name,-1);
        sq_newclosure(v,systemlib_funcs[i].f,0);
        sq_setparamscheck(v,systemlib_funcs[i].nparamscheck,systemlib_funcs[i].typemask);
        sq_setnativeclosurename(v,-1,systemlib_funcs[i].name);
        sq_newslot(v,-3,SQFalse);
        i++;
    }
    return 1;
}